

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

t_object *
xemmai::t_type_of<xemmai::t_string>::f__construct(t_type *a_class,wchar_t *a_p,size_t a_n)

{
  t_object *this;
  t_string *this_00;
  wchar_t *pwVar1;
  t_object *object;
  size_t a_n_local;
  wchar_t *a_p_local;
  t_type *a_class_local;
  
  this = f__construct(a_class,a_n);
  this_00 = (t_string *)t_object::f_data(this);
  t_string::t_string(this_00,a_n);
  pwVar1 = t_string::f_entries(this_00);
  pwVar1 = std::copy_n<wchar_t_const*,unsigned_long,wchar_t*>(a_p,a_n,pwVar1);
  *pwVar1 = L'\0';
  return this;
}

Assistant:

static t_object* f__construct(t_type* a_class, const wchar_t* a_p, size_t a_n)
	{
		auto object = f__construct(a_class, a_n);
		*std::copy_n(a_p, a_n, (new(object->f_data()) t_string(a_n))->f_entries()) = L'\0';
		return object;
	}